

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endecoder_common.c
# Opt level: O0

undefined1 * ossl_prov_get_keymgmt_free(OSSL_DISPATCH *fns)

{
  undefined1 *puVar1;
  OSSL_DISPATCH *in_RDI;
  OSSL_DISPATCH *local_10;
  
  local_10 = in_RDI;
  while( true ) {
    if (local_10->function_id == 0) {
      return (undefined1 *)0x0;
    }
    if (local_10->function_id == 10) break;
    local_10 = local_10 + 1;
  }
  puVar1 = OSSL_FUNC_keymgmt_free(local_10);
  return puVar1;
}

Assistant:

OSSL_FUNC_keymgmt_free_fn *
ossl_prov_get_keymgmt_free(const OSSL_DISPATCH *fns)
{
    /* Pilfer the keymgmt dispatch table */
    for (; fns->function_id != 0; fns++)
        if (fns->function_id == OSSL_FUNC_KEYMGMT_FREE)
            return OSSL_FUNC_keymgmt_free(fns);

    return NULL;
}